

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::reorderPatternsByPartition
          (BeagleCPUImpl<float,_1,_0> *this)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  double *pdVar4;
  int *piVar5;
  int **ppiVar6;
  float *pfVar7;
  float **ppfVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  byte bVar13;
  byte bVar14;
  int *piVar15;
  void *__ptr;
  double *pdVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  float *__ptr_00;
  long lVar24;
  int iVar25;
  int iVar26;
  float *pfVar27;
  float *__ptr_01;
  ushort uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  void *ptr;
  float *local_38;
  
  iVar19 = -7;
  if (this->kPatternsReordered == false) {
    iVar19 = this->kPatternCount;
    piVar15 = (int *)malloc((long)iVar19 * 4);
    this->gPatternsNewOrder = piVar15;
    iVar25 = this->kPartitionCount;
    __ptr = malloc((long)iVar25 * 4);
    pdVar16 = (double *)malloc((long)iVar19 << 3);
    if (0 < (long)iVar25) {
      piVar3 = this->gPatternPartitionsStartPatterns;
      lVar20 = 0;
      do {
        piVar3[lVar20] = 0;
        *(undefined4 *)((long)__ptr + lVar20 * 4) = 0;
        lVar20 = lVar20 + 1;
      } while (lVar20 < this->kPartitionCount);
    }
    iVar19 = this->kPatternCount;
    if (0 < (long)iVar19) {
      piVar3 = this->gPatternPartitions;
      lVar20 = 0;
      do {
        iVar25 = *(int *)((long)__ptr + (long)piVar3[lVar20] * 4);
        *(int *)((long)__ptr + (long)piVar3[lVar20] * 4) = iVar25 + 1;
        piVar15[lVar20] = iVar25;
        lVar20 = lVar20 + 1;
      } while (iVar19 != lVar20);
    }
    iVar19 = this->kPartitionCount;
    if (0 < iVar19) {
      piVar3 = this->gPatternPartitionsStartPatterns;
      uVar18 = 0xf;
      lVar20 = 0;
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        if (lVar20 != 0) {
          auVar35 = ZEXT464((uint)piVar3[lVar20]);
          auVar32 = vpbroadcastq_avx512f();
          uVar23 = 0;
          do {
            auVar33 = vmovdqa64_avx512f(auVar35);
            auVar35 = vpbroadcastq_avx512f();
            auVar34 = vporq_avx512f(auVar35,auVar30);
            auVar35 = vporq_avx512f(auVar35,auVar31);
            uVar12 = vpcmpuq_avx512f(auVar35,auVar32,2);
            bVar13 = (byte)uVar12;
            uVar12 = vpcmpuq_avx512f(auVar34,auVar32,2);
            bVar14 = (byte)uVar12;
            uVar28 = CONCAT11(bVar14,bVar13);
            auVar35 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)__ptr + uVar23 * 4));
            auVar34._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar35._4_4_;
            auVar34._0_4_ = (uint)(bVar13 & 1) * auVar35._0_4_;
            auVar34._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar35._8_4_;
            auVar34._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar35._12_4_;
            auVar34._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar35._16_4_;
            auVar34._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar35._20_4_;
            auVar34._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar35._24_4_;
            auVar34._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar35._28_4_;
            auVar34._32_4_ = (uint)(bVar14 & 1) * auVar35._32_4_;
            auVar34._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar35._36_4_;
            auVar34._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar35._40_4_;
            auVar34._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar35._44_4_;
            auVar34._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar35._48_4_;
            auVar34._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar35._52_4_;
            auVar34._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar35._56_4_;
            auVar34._60_4_ = (uint)(bVar14 >> 7) * auVar35._60_4_;
            auVar35 = vpaddd_avx512f(auVar33,auVar34);
            uVar23 = uVar23 + 0x10;
          } while ((uVar18 & 0xfffffffffffffff0) != uVar23);
          auVar32 = vmovdqa32_avx512f(auVar35);
          auVar35._0_4_ =
               (uint)(bVar13 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar33._0_4_;
          bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar35._4_4_ = (uint)bVar9 * auVar32._4_4_ | (uint)!bVar9 * auVar33._4_4_;
          bVar9 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar35._8_4_ = (uint)bVar9 * auVar32._8_4_ | (uint)!bVar9 * auVar33._8_4_;
          bVar9 = (bool)((byte)(uVar28 >> 3) & 1);
          auVar35._12_4_ = (uint)bVar9 * auVar32._12_4_ | (uint)!bVar9 * auVar33._12_4_;
          bVar9 = (bool)((byte)(uVar28 >> 4) & 1);
          auVar35._16_4_ = (uint)bVar9 * auVar32._16_4_ | (uint)!bVar9 * auVar33._16_4_;
          bVar9 = (bool)((byte)(uVar28 >> 5) & 1);
          auVar35._20_4_ = (uint)bVar9 * auVar32._20_4_ | (uint)!bVar9 * auVar33._20_4_;
          bVar9 = (bool)((byte)(uVar28 >> 6) & 1);
          auVar35._24_4_ = (uint)bVar9 * auVar32._24_4_ | (uint)!bVar9 * auVar33._24_4_;
          bVar9 = (bool)((byte)(uVar28 >> 7) & 1);
          auVar35._28_4_ = (uint)bVar9 * auVar32._28_4_ | (uint)!bVar9 * auVar33._28_4_;
          auVar35._32_4_ =
               (uint)(bVar14 & 1) * auVar32._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar33._32_4_;
          bVar9 = (bool)(bVar14 >> 1 & 1);
          auVar35._36_4_ = (uint)bVar9 * auVar32._36_4_ | (uint)!bVar9 * auVar33._36_4_;
          bVar9 = (bool)(bVar14 >> 2 & 1);
          auVar35._40_4_ = (uint)bVar9 * auVar32._40_4_ | (uint)!bVar9 * auVar33._40_4_;
          bVar9 = (bool)(bVar14 >> 3 & 1);
          auVar35._44_4_ = (uint)bVar9 * auVar32._44_4_ | (uint)!bVar9 * auVar33._44_4_;
          bVar9 = (bool)(bVar14 >> 4 & 1);
          auVar35._48_4_ = (uint)bVar9 * auVar32._48_4_ | (uint)!bVar9 * auVar33._48_4_;
          bVar9 = (bool)(bVar14 >> 5 & 1);
          auVar35._52_4_ = (uint)bVar9 * auVar32._52_4_ | (uint)!bVar9 * auVar33._52_4_;
          bVar9 = (bool)(bVar14 >> 6 & 1);
          auVar35._56_4_ = (uint)bVar9 * auVar32._56_4_ | (uint)!bVar9 * auVar33._56_4_;
          auVar35._60_4_ =
               (uint)(bVar14 >> 7) * auVar32._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar33._60_4_;
          auVar29 = vextracti64x4_avx512f(auVar35,1);
          auVar32 = vpaddd_avx512f(auVar35,ZEXT3264(auVar29));
          auVar10 = vpaddd_avx(auVar32._0_16_,auVar32._16_16_);
          auVar11 = vpshufd_avx(auVar10,0xee);
          auVar10 = vpaddd_avx(auVar10,auVar11);
          auVar11 = vpshufd_avx(auVar10,0x55);
          auVar10 = vpaddd_avx(auVar10,auVar11);
          piVar3[lVar20] = auVar10._0_4_;
        }
        lVar20 = lVar20 + 1;
        iVar19 = this->kPartitionCount;
        uVar18 = uVar18 + 1;
      } while (lVar20 < iVar19);
    }
    piVar3 = this->gPatternPartitionsStartPatterns;
    piVar3[iVar19] = this->kPatternCount;
    iVar19 = this->kPatternCount;
    if (0 < (long)iVar19) {
      pdVar4 = this->gPatternWeights;
      piVar5 = this->gPatternPartitions;
      lVar20 = 0;
      do {
        lVar24 = (long)piVar15[lVar20] + (long)piVar3[piVar5[lVar20]];
        piVar15[lVar20] = (int)lVar24;
        pdVar16[lVar24] = pdVar4[lVar20];
        lVar20 = lVar20 + 1;
      } while (iVar19 != lVar20);
    }
    if (0 < this->kPartitionCount) {
      piVar15 = this->gPatternPartitions;
      lVar20 = 0;
      iVar19 = 0;
      do {
        iVar25 = *(int *)((long)__ptr + lVar20 * 4);
        if (0 < iVar25) {
          lVar24 = 0;
          do {
            piVar15[iVar19 + lVar24] = (int)lVar20;
            lVar24 = lVar24 + 1;
          } while (iVar25 != (int)lVar24);
          iVar19 = iVar19 + (int)lVar24;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < this->kPartitionCount);
    }
    free(__ptr);
    free(this->gPatternWeights);
    this->gPatternWeights = pdVar16;
    local_38 = (float *)0x0;
    posix_memalign(&local_38,0x20,(long)this->kPartialsSize << 2);
    __ptr_00 = local_38;
    local_38 = (float *)0x0;
    posix_memalign(&local_38,0x20,(long)this->kPaddedPatternCount << 2);
    __ptr_01 = local_38;
    if (0 < this->kTipCount) {
      lVar20 = 0;
      pfVar27 = __ptr_00;
      do {
        ppiVar6 = this->gTipStates;
        pfVar7 = (float *)ppiVar6[lVar20];
        if (pfVar7 == (float *)0x0) {
          ppfVar8 = this->gPartials;
          __ptr_00 = ppfVar8[lVar20];
          iVar19 = this->kCategoryCount;
          if (0 < iVar19) {
            uVar1 = this->kPatternCount;
            uVar2 = this->kStateCount;
            iVar25 = 0;
            iVar26 = 0;
            do {
              if (0 < (int)uVar1) {
                piVar15 = this->gPatternsNewOrder;
                uVar18 = 0;
                iVar22 = iVar25;
                do {
                  if (0 < (int)uVar2) {
                    iVar17 = piVar15[uVar18] * uVar2 + iVar25;
                    uVar23 = (ulong)uVar2;
                    iVar21 = iVar22;
                    do {
                      pfVar27[iVar17] = __ptr_00[iVar21];
                      iVar17 = iVar17 + 1;
                      iVar21 = iVar21 + 1;
                      uVar23 = uVar23 - 1;
                    } while (uVar23 != 0);
                  }
                  uVar18 = uVar18 + 1;
                  iVar22 = iVar22 + uVar2;
                } while (uVar18 != uVar1);
              }
              iVar26 = iVar26 + 1;
              iVar25 = iVar25 + uVar1 * uVar2;
            } while (iVar26 != iVar19);
          }
          ppfVar8[lVar20] = pfVar27;
        }
        else {
          if (0 < this->kPatternCount) {
            piVar15 = this->gPatternsNewOrder;
            lVar24 = 0;
            do {
              __ptr_01[piVar15[lVar24]] = pfVar7[lVar24];
              lVar24 = lVar24 + 1;
            } while (lVar24 < this->kPatternCount);
          }
          ppiVar6[lVar20] = (int *)__ptr_01;
          __ptr_00 = pfVar27;
          __ptr_01 = pfVar7;
        }
        lVar20 = lVar20 + 1;
        pfVar27 = __ptr_00;
      } while (lVar20 < this->kTipCount);
    }
    free(__ptr_00);
    free(__ptr_01);
    this->kPatternsReordered = true;
    iVar19 = 0;
  }
  return iVar19;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::reorderPatternsByPartition() {

    if (!kPatternsReordered) {
        gPatternsNewOrder = (int*) malloc(kPatternCount * sizeof(int));
    } else {
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
    }

    int* partitionSizes = (int*) malloc(kPartitionCount * sizeof(int));
    double* sortedPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);

    for (int i=0; i < kPartitionCount; i++) {
        gPatternPartitionsStartPatterns[i] = 0;
        partitionSizes[i] = 0;
    }

    for (int i=0; i < kPatternCount; i++) {
         gPatternsNewOrder[i] = partitionSizes[gPatternPartitions[i]]++;
    }

    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < i; j++) {
            gPatternPartitionsStartPatterns[i] += partitionSizes[j];
        }
    }
    gPatternPartitionsStartPatterns[kPartitionCount] = kPatternCount;

    for (int i=0; i < kPatternCount; i++) {
        gPatternsNewOrder[i] += gPatternPartitionsStartPatterns[gPatternPartitions[i]];
        sortedPatternWeights[gPatternsNewOrder[i]] = gPatternWeights[i];
    }


    int currentPattern = 0;
    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < partitionSizes[i]; j++) {
            gPatternPartitions[currentPattern++] = i;
        }
    }

    free(partitionSizes);
    free(gPatternWeights);
    gPatternWeights = sortedPatternWeights;

    REALTYPE* sortedPartials = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
    int* sortedTips = (int*) mallocAligned(sizeof(int) * kPaddedPatternCount);

    for (int tip=0; tip < kTipCount; tip++) {
        if (gTipStates[tip] == NULL) {
            REALTYPE* unsortedPartials = gPartials[tip];
            for (int l=0; l < kCategoryCount; l++) {
                for (int i=0; i < kPatternCount; i++) {
                    for (int j=0; j < kStateCount; j++) {
                        int sortIndex = l*kStateCount*kPatternCount + gPatternsNewOrder[i]*kStateCount + j;
                        int pIndex = l*kStateCount*kPatternCount + i*kStateCount + j;
                        sortedPartials[sortIndex] = unsortedPartials[pIndex];
                    }
                }
            }
            gPartials[tip] = sortedPartials;
            sortedPartials = unsortedPartials;
        } else {
            int* unsortedTips = gTipStates[tip];
            for (int i=0; i < kPatternCount; i++) {
                int sortIndex = gPatternsNewOrder[i];
                int pIndex = i;
                sortedTips[sortIndex] = unsortedTips[pIndex];
            }
            gTipStates[tip] = sortedTips;
            sortedTips = unsortedTips;
        }
    }

    free(sortedPartials);
    free(sortedTips);

    kPatternsReordered = true;

    return BEAGLE_SUCCESS;
}